

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_t.cpp
# Opt level: O2

string * __thiscall deci::number_t::ToText_abi_cxx11_(string *__return_storage_ptr__,number_t *this)

{
  allocator local_59;
  char buffer [64];
  
  snprintf(buffer,0x40,"%.*g",this->val,0x15);
  std::__cxx11::string::string((string *)__return_storage_ptr__,buffer,&local_59);
  return __return_storage_ptr__;
}

Assistant:

std::string number_t::ToText() const {
    char buffer[64];
    snprintf(buffer, sizeof(buffer), "%.*g", DECIMAL_DIG, this->val);
    return std::string(buffer);
  }